

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
           *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_921;
  string local_920;
  TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> local_900;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_920,"TPZGeoElRefLess",&local_921);
  uVar1 = Hash(&local_920);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZTriangleSphere
            (&local_900);
  iVar3 = pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::ClassId
                    (&local_900);
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::~TPZTriangleSphere
            (&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}